

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O0

void * __thiscall btGenericPoolAllocator::allocate(btGenericPoolAllocator *this,size_t size_bytes)

{
  btGenericPoolAllocator *in_RSI;
  long in_RDI;
  size_t i;
  void *ptr;
  ulong local_28;
  void *local_8;
  
  local_8 = (void *)0x0;
  for (local_28 = 0; local_28 < *(ulong *)(in_RDI + 0x98) && local_8 == (void *)0x0;
      local_28 = local_28 + 1) {
    local_8 = btGenericMemoryPool::allocate((btGenericMemoryPool *)in_RSI,(size_t)local_8);
  }
  if (local_8 == (void *)0x0) {
    local_8 = failback_alloc(in_RSI,0);
  }
  return local_8;
}

Assistant:

void * btGenericPoolAllocator::allocate(size_t size_bytes)
{
	void * ptr = NULL;

	size_t i = 0;
	while(i<m_pool_count && ptr == NULL)
	{
		ptr = m_pools[i]->allocate(size_bytes);
		++i;
	}

	if(ptr) return ptr;

	return failback_alloc(size_bytes);
}